

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O1

void strbuf_append_fmt_retry(strbuf_t *s,char *fmt,...)

{
  int iVar1;
  uint uVar2;
  char in_AL;
  int iVar3;
  bool bVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_100 = &arg[0].overflow_arg_area;
  local_108 = 0x3000000010;
  iVar1 = s->size;
  uVar2 = s->length;
  local_f8 = local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar3 = vsnprintf(s->buf + (int)uVar2,(long)(int)(iVar1 - uVar2),fmt,&local_108);
  if ((int)(~uVar2 + iVar1) < iVar3) {
    bVar4 = true;
    do {
      if (!bVar4) {
        die("BUG: length of formatted string changed");
      }
      strbuf_resize(s,iVar3 + s->length);
      local_100 = &arg[0].overflow_arg_area;
      local_108 = 0x3000000010;
      iVar1 = s->size;
      uVar2 = s->length;
      local_f8 = local_e8;
      iVar3 = vsnprintf(s->buf + (int)uVar2,(long)(int)(iVar1 - uVar2),fmt,&local_108);
      bVar4 = false;
    } while ((int)(~uVar2 + iVar1) < iVar3);
  }
  s->length = s->length + iVar3;
  return;
}

Assistant:

void strbuf_append_fmt_retry(strbuf_t *s, const char *fmt, ...)
{
    va_list arg;
    int fmt_len;
    int empty_len;
    int t;

    /* If the first attempt to append fails, resize the buffer appropriately
     * and try again */
    for (t = 0; ; t++) {
        va_start(arg, fmt);
        /* Append the new formatted string */
        /* fmt_len is the length of the string required, excluding the
         * trailing NULL */
        empty_len = strbuf_empty_length(s);
        /* Add 1 since there is also space to store the terminating NULL. */
        fmt_len = vsnprintf(s->buf + s->length, empty_len + 1, fmt, arg);
        va_end(arg);

        if (fmt_len <= empty_len)
            break;  /* SUCCESS */
        if (t > 0)
            die("BUG: length of formatted string changed");

        strbuf_resize(s, s->length + fmt_len);
    }

    s->length += fmt_len;
}